

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

wchar_t archive_read_format_cab_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  int64_t *piVar2;
  long *plVar3;
  wchar_t wVar4;
  size_t in_RAX;
  int64_t iVar5;
  void *pvVar6;
  size_t sVar7;
  long lVar8;
  size_t sStack_40;
  size_t local_38;
  
  piVar2 = (int64_t *)a->format->data;
  if (*(ushort *)(piVar2[6] + 0x10) < 0xfffd) {
    local_38 = in_RAX;
    if (*(char *)((long)piVar2 + 0x94) == '\0') {
      lVar8 = piVar2[0x13];
      if (lVar8 != 0) {
        if (piVar2[7] == 0) {
          wVar4 = cab_next_cfdata(a);
          if (wVar4 < L'\0') {
            sStack_40 = (size_t)(uint)wVar4;
            goto LAB_0013bf49;
          }
          lVar8 = piVar2[0x13];
        }
        iVar5 = cab_consume_cfdata(a,lVar8);
        if (iVar5 < 0) {
          sStack_40 = 0xffffffffffffffe2;
          goto LAB_0013bf49;
        }
        piVar2[0x13] = 0;
      }
      *(undefined1 *)((long)piVar2 + 0x94) = 1;
    }
    if (piVar2[2] != 0) {
      sStack_40 = cab_consume_cfdata(a,piVar2[2]);
      piVar2[2] = 0;
      if ((int)sStack_40 < 0) goto LAB_0013bf49;
    }
    if ((*(char *)((long)piVar2 + 0x91) == '\0') && (*(char *)((long)piVar2 + 0x92) == '\0')) {
      plVar3 = (long *)a->format->data;
      if (plVar3[1] == 0) {
        *buff = (void *)0x0;
        *size = 0;
        *offset = *plVar3;
        *(undefined1 *)((long)plVar3 + 0x92) = 1;
        sStack_40 = 0;
      }
      else {
        pvVar6 = cab_read_ahead_cfdata(a,(ssize_t *)&local_38);
        *buff = pvVar6;
        if ((long)local_38 < 1) {
          *buff = (void *)0x0;
          *size = 0;
          *offset = 0;
          sStack_40 = local_38;
          if ((local_38 == 0) && (*(short *)(plVar3[7] + 8) == 0)) {
            sStack_40 = 0xffffffffffffffe2;
            archive_set_error(&a->archive,0x54,"Invalid CFDATA");
          }
        }
        else {
          sVar7 = plVar3[1];
          if ((long)local_38 < plVar3[1]) {
            sVar7 = local_38;
          }
          *size = sVar7;
          lVar8 = *plVar3;
          *offset = lVar8;
          *plVar3 = lVar8 + sVar7;
          plVar1 = plVar3 + 1;
          *plVar1 = *plVar1 - sVar7;
          if (*plVar1 == 0) {
            *(undefined1 *)((long)plVar3 + 0x92) = 1;
          }
          plVar3[2] = sVar7;
          sStack_40 = 0;
          if ((*(short *)(plVar3[5] + 6) == 0) && ((long)sVar7 < *(long *)(plVar3[7] + 0x10))) {
            *(size_t *)(plVar3[7] + 0x10) = sVar7;
            sStack_40 = 0;
          }
        }
      }
    }
    else {
      if (*(char *)((long)piVar2 + 0x93) == '\0') {
        *(undefined1 *)((long)piVar2 + 0x93) = 1;
      }
      *offset = *piVar2;
      *size = 0;
      *buff = (void *)0x0;
      sStack_40 = 1;
    }
  }
  else {
    *buff = (void *)0x0;
    *size = 0;
    *offset = 0;
    archive_clear_error(&a->archive);
    archive_set_error(&a->archive,0x54,"Cannot restore this file split in multivolume.");
    sStack_40 = 0xffffffffffffffe7;
  }
LAB_0013bf49:
  return (wchar_t)sStack_40;
}

Assistant:

static int
archive_read_format_cab_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int r;

	switch (cab->entry_cffile->folder) {
	case iFoldCONTINUED_FROM_PREV:
	case iFoldCONTINUED_TO_NEXT:
	case iFoldCONTINUED_PREV_AND_NEXT:
		*buff = NULL;
		*size = 0;
		*offset = 0;
		archive_clear_error(&a->archive);
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Cannot restore this file split in multivolume.");
		return (ARCHIVE_FAILED);
	default:
		break;
	}
	if (cab->read_data_invoked == 0) {
		if (cab->bytes_skipped) {
			if (cab->entry_cfdata == NULL) {
				r = cab_next_cfdata(a);
				if (r < 0)
					return (r);
			}
			if (cab_consume_cfdata(a, cab->bytes_skipped) < 0)
				return (ARCHIVE_FATAL);
			cab->bytes_skipped = 0;
		}
		cab->read_data_invoked = 1;
	}
	if (cab->entry_unconsumed) {
		/* Consume as much as the compressor actually used. */
		r = (int)cab_consume_cfdata(a, cab->entry_unconsumed);
		cab->entry_unconsumed = 0;
		if (r < 0)
			return (r);
	}
	if (cab->end_of_archive || cab->end_of_entry) {
		if (!cab->end_of_entry_cleanup) {
			/* End-of-entry cleanup done. */
			cab->end_of_entry_cleanup = 1;
		}
		*offset = cab->entry_offset;
		*size = 0;
		*buff = NULL;
		return (ARCHIVE_EOF);
	}

	return (cab_read_data(a, buff, size, offset));
}